

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O1

void * expand_buffer(lua_State *L,int osz,int nsz)

{
  void *pvVar1;
  int iVar2;
  
  do {
    iVar2 = osz;
    osz = iVar2 * 2;
  } while (osz < nsz);
  if (iVar2 < 0x800001) {
    pvVar1 = lua_newuserdata(L,(long)osz);
    lua_copy(L,-1,-0xf4629);
    lua_settop(L,-2);
    lua_pushinteger(L,(long)osz);
    lua_copy(L,-1,-0xf462a);
    lua_settop(L,-2);
  }
  else {
    luaL_error(L,"object is too large (>%d)",0x1000000);
    pvVar1 = (void *)0x0;
  }
  return pvVar1;
}

Assistant:

static void *
expand_buffer(lua_State *L, int osz, int nsz) {
	void *output;
	do {
		osz *= 2;
	} while (osz < nsz);
	if (osz > ENCODE_MAXSIZE) {
		luaL_error(L, "object is too large (>%d)", ENCODE_MAXSIZE);
		return NULL;
	}
	output = lua_newuserdata(L, osz);
	lua_replace(L, lua_upvalueindex(1));
	lua_pushinteger(L, osz);
	lua_replace(L, lua_upvalueindex(2));

	return output;
}